

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

void setmangry(monst *mtmp)

{
  byte *pbVar1;
  short sVar2;
  uint uVar3;
  level *lev;
  boolean bVar4;
  char rmno;
  short sVar5;
  char *pcVar6;
  monst *pmVar7;
  char *pcVar8;
  int iVar9;
  
  pbVar1 = (byte *)((long)&mtmp->mstrategy + 3);
  *pbVar1 = *pbVar1 & 0xcf;
  bVar4 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
  if ((bVar4 != '\0') && ((*(uint *)&mtmp->field_0x60 & 0x2400000) == 0x2000000)) {
    blkmar_guards(mtmp);
  }
  uVar3 = *(uint *)&mtmp->field_0x60;
  if (((uVar3 >> 0x16 & 1) != 0) && (mtmp->mtame == '\0')) {
    *(uint *)&mtmp->field_0x60 = uVar3 & 0xffbfffff;
    iVar9 = -1;
    if ((uVar3 >> 0x1c & 1) != 0) {
      bVar4 = p_coaligned(mtmp);
      iVar9 = -5;
      if (bVar4 == '\0') {
        iVar9 = 2;
      }
    }
    adjalign(iVar9);
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0) {
      if (((mtmp->data->mflags1 & 0x20000) == 0) && ((mtmp->field_0x63 & 10) == 0)) {
        if ((flags.verbose != '\0') && (flags.soundok != '\0')) {
          growl(mtmp);
        }
      }
      else {
        pcVar6 = Monnam(mtmp);
        pline("%s gets angry!",pcVar6);
      }
    }
    bVar4 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
    lev = level;
    if (bVar4 != '\0') {
      if ((mtmp->field_0x63 & 2) == 0) {
        if (*(char *)((long)(mtmp->mtrack + 0x18) + (long)mtmp->mxlth) != '\0') {
          rmno = inside_shop(level,mtmp->mx,mtmp->my);
          pmVar7 = shop_keeper(lev,rmno);
          if (pmVar7 != (monst *)0x0) {
            wakeup(pmVar7);
          }
        }
      }
      else {
        blkmar_guards(mtmp);
      }
    }
    if ((flags.mon_moving == '\0') && (sVar2 = mtmp->mnum, sVar5 = quest_info(0x1f), sVar2 == sVar5)
       ) {
      iVar9 = 0;
      for (pmVar7 = level->monlist; pmVar7 != (monst *)0x0; pmVar7 = pmVar7->nmon) {
        if (((0 < pmVar7->mhp) && (pmVar7->data == &pm_guardian)) &&
           ((*(uint *)&pmVar7->field_0x60 >> 0x16 & 1) != 0)) {
          *(uint *)&pmVar7->field_0x60 = *(uint *)&pmVar7->field_0x60 & 0xffbfffff;
          if (pmVar7->wormno == '\0') {
            if (((viz_array[pmVar7->my][pmVar7->mx] & 2U) != 0) ||
               (((((u.uprops[0x1e].intrinsic == 0 &&
                   ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                 ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                  (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                 (((viz_array[pmVar7->my][pmVar7->mx] & 1U) != 0 &&
                  ((pm_guardian.mflags3 & 0x200) != 0)))))))) goto LAB_001eafd9;
          }
          else {
            bVar4 = worm_known(level,pmVar7);
            if (bVar4 != '\0') {
LAB_001eafd9:
              uVar3 = *(uint *)&pmVar7->field_0x60;
              if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar3 & 0x280) == 0) goto LAB_001eb014;
              }
              else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001eb014:
                iVar9 = iVar9 + (uint)((u._1052_1_ & 0x20) == 0);
              }
            }
          }
        }
      }
      if ((iVar9 != 0) &&
         (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
          ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))))) {
        pcVar6 = mons_mname(&pm_guardian);
        if (iVar9 == 1) {
          pcVar8 = "s";
        }
        else {
          pcVar6 = makeplural(pcVar6);
          pcVar8 = "";
        }
        pline("The %s appear%s to be angry too...",pcVar6,pcVar8);
        return;
      }
    }
  }
  return;
}

Assistant:

void setmangry(struct monst *mtmp)
{
	mtmp->mstrategy &= ~STRAT_WAITMASK;

	/* Even if the black marketeer is already angry he may not have called
	 * for his assistants if he or his staff have not been assaulted yet.
	 */
	if (Is_blackmarket(&u.uz) && !mtmp->mpeaceful && mtmp->isshk)
	    blkmar_guards(mtmp);

	if (!mtmp->mpeaceful) return;
	if (mtmp->mtame) return;
	mtmp->mpeaceful = 0;
	if (mtmp->ispriest) {
		if (p_coaligned(mtmp)) adjalign(-5); /* very bad */
		else adjalign(2);
	} else
		adjalign(-1);		/* attacking peaceful monsters is bad */
	if (couldsee(mtmp->mx, mtmp->my)) {
		if (humanoid(mtmp->data) || mtmp->isshk || mtmp->isgd)
		    pline("%s gets angry!", Monnam(mtmp));
		else if (flags.verbose && flags.soundok) growl(mtmp);
	}

	/* Don't misbehave in the Black Market or else... */
	if (Is_blackmarket(&u.uz)) {
	    if (mtmp->isshk) {
		blkmar_guards(mtmp);
	    } else if (NAME(mtmp) && *NAME(mtmp)) {
		/* non-tame named monsters are presumably
		 * black marketeer's assistants */
		struct monst *shkp = shop_keeper(level,
			inside_shop(level, mtmp->mx, mtmp->my));
		if (shkp)
		    wakeup(shkp);
	    }
	}

	/* attacking your own quest leader will anger his or her guardians */
	if (!flags.mon_moving &&	/* should always be the case here */
		mtmp->mnum == quest_info(MS_LEADER)) {
	    struct monst *mon;
	    int got_mad = 0;

	    /* guardians will sense this attack even if they can't see it */
	    for (mon = level->monlist; mon; mon = mon->nmon)
		if (!DEADMONSTER(mon) && mon->data == &pm_guardian && mon->mpeaceful) {
		    mon->mpeaceful = 0;
		    if (canseemon(level, mon)) ++got_mad;
		}
	    if (got_mad && !Hallucination)
		pline("The %s appear%s to be angry too...",
		      got_mad == 1 ? mons_mname(&pm_guardian) :
				    makeplural(mons_mname(&pm_guardian)),
		      got_mad == 1 ? "s" : "");
	}
}